

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall sznet::net::TcpClient::newConnection(TcpClient *this,sz_sock sockfd)

{
  undefined8 uVar1;
  TcpConnection *this_00;
  element_type *peVar2;
  MutexLockGuard local_170;
  MutexLockGuard lock;
  code *local_160;
  undefined8 local_158;
  type local_150;
  CloseCallback local_138;
  undefined1 local_118 [8];
  TcpConnectionPtr conn;
  sockaddr_in6 local_f8;
  undefined1 local_dc [8];
  InetAddress localAddr;
  string connName;
  string local_a0 [36];
  uint local_7c;
  char local_78 [4];
  uint32_t connId;
  char buf [32];
  sockaddr_in6 local_4c;
  undefined1 local_30 [8];
  InetAddress peerAddr;
  sz_sock sockfd_local;
  TcpClient *this_local;
  
  peerAddr.field_0._20_4_ = sockfd;
  unique0x1000041a = this;
  EventLoop::assertInLoopThread(this->m_loop);
  sockets::sz_sock_getpeeraddr(&local_4c,peerAddr.field_0._20_4_);
  InetAddress::InetAddress((InetAddress *)local_30,&local_4c);
  local_7c = this->m_nextConnId;
  this->m_nextConnId = local_7c + 1;
  InetAddress::toIpPort_abi_cxx11_((InetAddress *)local_a0);
  uVar1 = std::__cxx11::string::c_str();
  snprintf(local_78,0x20,":%s#%d",uVar1,(ulong)local_7c);
  std::__cxx11::string::~string(local_a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (localAddr.field_0.m_addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc),
                 (char *)&this->m_name);
  sockets::sz_sock_getlocaladdr(&local_f8,peerAddr.field_0._20_4_);
  InetAddress::InetAddress((InetAddress *)local_dc,&local_f8);
  this_00 = (TcpConnection *)operator_new(0x1d0);
  TcpConnection::TcpConnection
            (this_00,this->m_loop,
             (string *)(localAddr.field_0.m_addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc),local_7c,
             peerAddr.field_0._20_4_,(InetAddress *)local_dc,(InetAddress *)local_30);
  std::shared_ptr<sznet::net::TcpConnection>::shared_ptr<sznet::net::TcpConnection,void>
            ((shared_ptr<sznet::net::TcpConnection> *)local_118,this_00);
  peVar2 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_118);
  TcpConnection::setConnectionCallback(peVar2,&this->m_connectionCallback);
  peVar2 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_118);
  TcpConnection::setMessageCallback(peVar2,&this->m_messageCallback);
  peVar2 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_118);
  TcpConnection::setWriteCompleteCallback(peVar2,&this->m_writeCompleteCallback);
  peVar2 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_118);
  local_160 = removeConnection;
  local_158 = 0;
  lock.m_mutex = (MutexLock *)this;
  std::
  bind<void(sznet::net::TcpClient::*)(std::shared_ptr<sznet::net::TcpConnection>const&),sznet::net::TcpClient*,std::_Placeholder<1>const&>
            (&local_150,(offset_in_TcpClient_to_subr *)&local_160,(TcpClient **)&lock,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
  function<std::_Bind<void(sznet::net::TcpClient::*(sznet::net::TcpClient*,std::_Placeholder<1>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)&local_138,
             &local_150);
  TcpConnection::setCloseCallback(peVar2,&local_138);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function(&local_138);
  MutexLockGuard::MutexLockGuard(&local_170,&this->m_mutex);
  std::shared_ptr<sznet::net::TcpConnection>::operator=
            (&this->m_connection,(shared_ptr<sznet::net::TcpConnection> *)local_118);
  MutexLockGuard::~MutexLockGuard(&local_170);
  peVar2 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_118);
  TcpConnection::connectEstablished(peVar2);
  std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
            ((shared_ptr<sznet::net::TcpConnection> *)local_118);
  std::__cxx11::string::~string
            ((string *)(localAddr.field_0.m_addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
  return;
}

Assistant:

void TcpClient::newConnection(sockets::sz_sock sockfd)
{
	m_loop->assertInLoopThread();
	InetAddress peerAddr(sockets::sz_sock_getpeeraddr(sockfd));
	char buf[32];
	uint32_t connId = m_nextConnId++;
	snprintf(buf, sizeof(buf), ":%s#%d", peerAddr.toIpPort().c_str(), connId);
	string connName = m_name + buf;

	InetAddress localAddr(sockets::sz_sock_getlocaladdr(sockfd));
	// FIXME poll with zero timeout to double confirm the new connection
	// FIXME use make_shared if necessary
	TcpConnectionPtr conn(new TcpConnection(m_loop, connName, connId, sockfd, localAddr, peerAddr));
	conn->setConnectionCallback(m_connectionCallback);
	conn->setMessageCallback(m_messageCallback);
	conn->setWriteCompleteCallback(m_writeCompleteCallback);
	// FIXME: unsafe
	conn->setCloseCallback(std::bind(&TcpClient::removeConnection, this, std::placeholders::_1));
	// ��������ͬʱ��д����race condition
	{
		MutexLockGuard lock(m_mutex);
		m_connection = conn;
	}
	conn->connectEstablished();
}